

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDD.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChNodeFEAxyzDD::NodeIntLoadResidual_Mv
          (ChNodeFEAxyzDD *this,uint off,ChVectorDynamic<> *R,ChVectorDynamic<> *w,double c)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  CoeffReturnType pdVar12;
  Scalar *pSVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  
  dVar14 = c;
  (*(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase._vptr_ChNodeFEAbase[9])();
  dVar14 = dVar14 * c;
  pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)w,(ulong)off);
  dVar1 = *pdVar12;
  pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,(ulong)off);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar14;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar1;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *pSVar13;
  auVar2 = vfmadd213sd_fma(auVar24,auVar15,auVar2);
  *pSVar13 = auVar2._0_8_;
  (*(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase._vptr_ChNodeFEAbase[9])(this)
  ;
  dVar14 = dVar14 * c;
  pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)w,
                       (ulong)(off + 1));
  dVar1 = *pdVar12;
  pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                       (ulong)(off + 1));
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar14;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar1;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *pSVar13;
  auVar2 = vfmadd213sd_fma(auVar25,auVar16,auVar3);
  *pSVar13 = auVar2._0_8_;
  (*(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase._vptr_ChNodeFEAbase[9])(this)
  ;
  pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)w,
                       (ulong)(off + 2));
  dVar1 = *pdVar12;
  pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                       (ulong)(off + 2));
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar14 * c;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar1;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *pSVar13;
  auVar2 = vfmadd213sd_fma(auVar26,auVar17,auVar4);
  *pSVar13 = auVar2._0_8_;
  iVar11 = (*(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase._vptr_ChNodeFEAbase
             [0x23])(this);
  pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                       CONCAT44(extraout_var,iVar11),0);
  dVar1 = *pSVar13;
  pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)w,
                       (ulong)(off + 3));
  dVar14 = *pdVar12;
  pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                       (ulong)(off + 3));
  auVar18._8_8_ = 0;
  auVar18._0_8_ = c * dVar1;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar14;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *pSVar13;
  auVar2 = vfmadd213sd_fma(auVar27,auVar18,auVar5);
  *pSVar13 = auVar2._0_8_;
  iVar11 = (*(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase._vptr_ChNodeFEAbase
             [0x23])(this);
  pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                       CONCAT44(extraout_var_00,iVar11),1);
  dVar1 = *pSVar13;
  pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)w,
                       (ulong)(off + 4));
  dVar14 = *pdVar12;
  pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                       (ulong)(off + 4));
  auVar19._8_8_ = 0;
  auVar19._0_8_ = c * dVar1;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar14;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *pSVar13;
  auVar2 = vfmadd213sd_fma(auVar28,auVar19,auVar6);
  *pSVar13 = auVar2._0_8_;
  iVar11 = (*(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase._vptr_ChNodeFEAbase
             [0x23])(this);
  pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                       CONCAT44(extraout_var_01,iVar11),2);
  dVar1 = *pSVar13;
  pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)w,
                       (ulong)(off + 5));
  dVar14 = *pdVar12;
  pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                       (ulong)(off + 5));
  auVar20._8_8_ = 0;
  auVar20._0_8_ = c * dVar1;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar14;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *pSVar13;
  auVar2 = vfmadd213sd_fma(auVar29,auVar20,auVar7);
  *pSVar13 = auVar2._0_8_;
  iVar11 = (*(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase._vptr_ChNodeFEAbase
             [0x2e])(this);
  pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                       CONCAT44(extraout_var_02,iVar11),0);
  dVar1 = *pSVar13;
  pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)w,
                       (ulong)(off + 6));
  dVar14 = *pdVar12;
  pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                       (ulong)(off + 6));
  auVar21._8_8_ = 0;
  auVar21._0_8_ = c * dVar1;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar14;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *pSVar13;
  auVar2 = vfmadd213sd_fma(auVar30,auVar21,auVar8);
  *pSVar13 = auVar2._0_8_;
  iVar11 = (*(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase._vptr_ChNodeFEAbase
             [0x2e])(this);
  pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                       CONCAT44(extraout_var_03,iVar11),1);
  dVar1 = *pSVar13;
  pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)w,
                       (ulong)(off + 7));
  dVar14 = *pdVar12;
  pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                       (ulong)(off + 7));
  auVar22._8_8_ = 0;
  auVar22._0_8_ = c * dVar1;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar14;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *pSVar13;
  auVar2 = vfmadd213sd_fma(auVar31,auVar22,auVar9);
  *pSVar13 = auVar2._0_8_;
  iVar11 = (*(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase._vptr_ChNodeFEAbase
             [0x2e])(this);
  pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                       CONCAT44(extraout_var_04,iVar11),2);
  dVar1 = *pSVar13;
  pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)w,
                       (ulong)(off + 8));
  dVar14 = *pdVar12;
  pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                       (ulong)(off + 8));
  auVar23._8_8_ = 0;
  auVar23._0_8_ = c * dVar1;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar14;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *pSVar13;
  auVar2 = vfmadd213sd_fma(auVar32,auVar23,auVar10);
  *pSVar13 = auVar2._0_8_;
  return;
}

Assistant:

void ChNodeFEAxyzDD::NodeIntLoadResidual_Mv(const unsigned int off,
                                            ChVectorDynamic<>& R,
                                            const ChVectorDynamic<>& w,
                                            const double c) {
    R(off + 0) += c * GetMass() * w(off + 0);
    R(off + 1) += c * GetMass() * w(off + 1);
    R(off + 2) += c * GetMass() * w(off + 2);
    R(off + 3) += c * GetMassDiagonal()(0) * w(off + 3);  // unuseful? mass for D isalways zero..
    R(off + 4) += c * GetMassDiagonal()(1) * w(off + 4);
    R(off + 5) += c * GetMassDiagonal()(2) * w(off + 5);
    R(off + 6) += c * GetMassDiagonalDD()(0) * w(off + 6);
    R(off + 7) += c * GetMassDiagonalDD()(1) * w(off + 7);
    R(off + 8) += c * GetMassDiagonalDD()(2) * w(off + 8);
}